

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testclip.cpp
# Opt level: O2

void perceive_expose_event
               (Am_Drawonable *d,int count,int clip_left,int clip_top,unsigned_short clip_width,
               unsigned_short clip_height)

{
  int iVar1;
  
  if (perceive_expose_event(Am_Drawonable*,int,int,int,unsigned_short,unsigned_short)::the_region ==
      '\0') {
    iVar1 = __cxa_guard_acquire(&perceive_expose_event(Am_Drawonable*,int,int,int,unsigned_short,unsigned_short)
                                 ::the_region);
    if (iVar1 != 0) {
      perceive_expose_event::the_region = (Am_Region *)Am_Region::Create();
      __cxa_guard_release(&perceive_expose_event(Am_Drawonable*,int,int,int,unsigned_short,unsigned_short)
                           ::the_region);
    }
  }
  (**(code **)(*(long *)perceive_expose_event::the_region + 0x50))
            (perceive_expose_event::the_region,clip_left,clip_top,clip_width,clip_height);
  if (count == 0) {
    (**(code **)(*(long *)d + 0xf0))(d,perceive_expose_event::the_region);
    (**(code **)(*(long *)perceive_expose_event::the_region + 8))();
    perceive_expose_event::the_region = (Am_Region *)Am_Region::Create();
  }
  return;
}

Assistant:

void
perceive_expose_event(Am_Drawonable *d, int count, int clip_left, int clip_top,
                      unsigned short clip_width, unsigned short clip_height)
{
  // Since the_region is static, it will not be automatically reinitialized
  // each time the function is invoked.  It is only cleared at the end of
  // this function when count is 0.  This is why you can call this function
  // multiple times with a non-zero count to enlarge the clip region, and
  // then finally install it in the GC when count is 0.
  static Am_Region *the_region = Am_Region::Create();

  the_region->Union(clip_left, clip_top, clip_width, clip_height);

  /* If this is the last expose in a contiguous group,
     set the clip region, then clear it for next time. */
  if (count == 0) {
    d->Set_Clip(the_region);
    the_region->Destroy();
    the_region = Am_Region::Create();
  }
}